

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O0

int gzrewind(gzFile file)

{
  __off64_t _Var1;
  gz_statep state;
  gzFile file_local;
  
  if (file == (gzFile)0x0) {
    file_local._4_4_ = -1;
  }
  else if ((file[1].have == 0x1c4f) &&
          ((*(int *)((long)&file[4].pos + 4) == 0 || (*(int *)((long)&file[4].pos + 4) == -5)))) {
    _Var1 = lseek64(*(int *)&file[1].field_0x4,*(__off64_t *)(file + 3),0);
    if (_Var1 == -1) {
      file_local._4_4_ = -1;
    }
    else {
      gz_reset((gz_statep)file);
      file_local._4_4_ = 0;
    }
  }
  else {
    file_local._4_4_ = -1;
  }
  return file_local._4_4_;
}

Assistant:

int ZEXPORT gzrewind(gzFile file) {
    gz_statep state;

    /* get internal structure */
    if (file == NULL)
        return -1;
    state = (gz_statep)file;

    /* check that we're reading and that there's no error */
    if (state->mode != GZ_READ ||
            (state->err != Z_OK && state->err != Z_BUF_ERROR))
        return -1;

    /* back up and start over */
    if (LSEEK(state->fd, state->start, SEEK_SET) == -1)
        return -1;
    gz_reset(state);
    return 0;
}